

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,bool pendingDispose)

{
  HeapBlockType *corruptedAddress;
  SmallHeapBlockBitVector *this_00;
  HeapBlockType HVar1;
  ushort uVar2;
  FreeObject *pFVar3;
  char *pcVar4;
  code *pcVar5;
  anon_class_32_4_66517344 fn;
  Type *pTVar6;
  bool bVar7;
  BOOLEAN BVar8;
  uint uVar9;
  int iVar10;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *pSVar11;
  undefined4 *puVar12;
  FreeObject *pFVar13;
  undefined4 extraout_var;
  byte *pbVar14;
  undefined7 in_register_00000031;
  Type TVar15;
  uint index;
  FreeObject *this_01;
  BVIndex i;
  undefined1 local_298 [8];
  SmallHeapBlockBitVector tempFree;
  SmallHeapBlockBitVector tempPending;
  Type local_58;
  SmallHeapBlockBitVector *free;
  Type local_48;
  Type local_40;
  uint local_38;
  ushort local_32 [4];
  ushort verifyFinalizeCount;
  
  local_32[0] = 0;
  memset((SmallHeapBlockT<MediumAllocationBlockAttributes> *)local_298,0,0x100);
  local_58.word = (Type)local_298;
  memset(tempFree.data + 0x1f,0,0x100);
  BuildFreeBitVector(this,(SmallHeapBlockBitVector *)local_298);
  this_01 = (FreeObject *)(this->super_HeapBlock).address;
  uVar9 = 1;
  if ((((int)CONCAT71(in_register_00000031,pendingDispose) != 0) &&
      (HVar1 = (this->super_HeapBlock).heapBlockType, HVar1 != SmallFinalizableBlockType)) &&
     (HVar1 != MediumFinalizableBlockType)) {
    uVar9 = (uint)(HVar1 == MediumFinalizableBlockWithBarrierType ||
                  HVar1 == MediumAllocBlockTypeCount);
  }
  uVar2 = this->objectSize;
  free = (SmallHeapBlockBitVector *)this->heapBucket->heapInfo->recycler;
  corruptedAddress = &(this->super_HeapBlock).heapBlockType;
  Recycler::VerifyCheck
            (uVar9,L"Non-finalizable block shouldn\'t be disposing. May have corrupted block type.",
             this_01,corruptedAddress);
  uVar9 = (uint)(this->super_HeapBlock).heapBlockType;
  if (((uVar9 < 0xb) && ((0x528U >> (uVar9 & 0x1f) & 1) != 0)) &&
     (pSVar11 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                          (&this->super_HeapBlock), pSVar11->pendingDisposeCount != 0)) {
    if (!pendingDispose) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x825,"(pendingDispose)","pendingDispose");
      if (!bVar7) goto LAB_006b8713;
      *puVar12 = 0;
    }
    pSVar11 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>(&this->super_HeapBlock)
    ;
    fn.free = (SmallHeapBlockBitVector **)&local_58;
    fn.this = this;
    fn.tempPending = (SmallHeapBlockBitVector *)(tempFree.data + 0x1f);
    fn.verifyFinalizeCount = local_32;
    SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::
    ForEachPendingDisposeObject<Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::Verify(bool)::_lambda(unsigned_int)_1_>
              (pSVar11,fn);
  }
  if (this->objectCount != 0) {
    uVar2 = uVar2 >> 4;
    uVar9 = (uint)uVar2;
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    this_00 = &this->explicitFreeBits;
    pTVar6 = free->data;
    i = 0;
    index = 0;
    local_38 = (uint)uVar2;
    local_40.word = (Type)this;
    do {
      BVar8 = BVStatic<2048UL>::Test((BVStatic<2048UL> *)local_58.word,i);
      if (BVar8 == '\0') {
        BVar8 = BVStatic<2048UL>::Test(this_00,i);
        if (BVar8 == '\0') {
          Recycler::VerifyCheckPad((Recycler *)free,this_01,(ulong)this->objectSize);
        }
        else {
          pFVar13 = FreeObject::GetNext(this_01);
          if (pFVar13 != (FreeObject *)0x0) {
            if (((ulong)pFVar13 & 0xf) == 0 && (FreeObject *)0xffff < pFVar13) {
              this = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)
                     HeapBlockMap64::GetHeapBlock((HeapBlockMap64 *)(pTVar6 + 6),pFVar13);
            }
            else {
              this = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
            }
          }
          uVar9 = 1;
          TVar15.word = local_40.word;
          if (pFVar13 != (FreeObject *)0x0) {
            pFVar3 = (FreeObject *)((Type *)(local_40.word + 8))->word;
            if (pFVar13 < pFVar3 + 0x1000 && pFVar3 <= pFVar13) {
              local_48.word = (Type)this;
              if (((ulong)pFVar13 & 0xf) != 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                                   ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                                   "HeapInfo::IsAlignedAddress(objectAddress)");
                if (!bVar7) goto LAB_006b8713;
                *puVar12 = 0;
              }
              BVar8 = BVStatic<2048UL>::Test(this_00,(uint)((ulong)pFVar13 >> 4) & 0x7ff);
              uVar9 = 1;
              this = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)local_48.word;
              TVar15.word = local_40.word;
              if (BVar8 != '\0') goto LAB_006b85be;
            }
            TVar15.word = local_40.word;
            iVar10 = (*(this->super_HeapBlock)._vptr_HeapBlock[9])(this,pFVar13);
            uVar9 = (uint)(CONCAT44(extraout_var,iVar10) == (ulong)*(ushort *)(TVar15.word + 0x54));
          }
LAB_006b85be:
          Recycler::VerifyCheck
                    (uVar9,L"SmallHeapBlock memory written to after freed",this_01,this_01);
          Recycler::VerifyCheckPadExplicitFreeList
                    ((Recycler *)free,this_01,
                     (ulong)((SmallHeapBlockT<MediumAllocationBlockAttributes> *)TVar15.word)->
                            objectSize);
          this = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)TVar15.word;
          uVar9 = local_38;
        }
        pbVar14 = ObjectInfo(this,index);
        if ((char)*pbVar14 < '\0') {
          if ((*corruptedAddress < 0xb) && ((0x528U >> (*corruptedAddress & 0x1f) & 1) != 0)) {
            local_32[0] = local_32[0] + 1;
          }
          else {
            pcVar4 = (this->super_HeapBlock).address;
            pbVar14 = ObjectInfo(this,index);
            uVar9 = local_38;
            Recycler::VerifyCheck
                      (0,L"Non-Finalizable block should not have finalizable objects",pcVar4,pbVar14
                      );
          }
        }
      }
      else {
        BVar8 = BVStatic<2048UL>::Test((BVStatic<2048UL> *)(tempFree.data + 0x1f),i);
        if (BVar8 == '\0') {
          pFVar13 = FreeObject::GetNext(this_01);
          if (pFVar13 == (FreeObject *)0x0) {
            uVar9 = 1;
          }
          else {
            pFVar3 = (FreeObject *)(this->super_HeapBlock).address;
            uVar9 = 0;
            if (pFVar13 < pFVar3 + 0x1000 && pFVar3 <= pFVar13) {
              TVar15.word = local_58.word;
              if (((ulong)pFVar13 & 0xf) != 0) {
                local_48.word = local_58.word;
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar12 = 1;
                bVar7 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                                   ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                                   "HeapInfo::IsAlignedAddress(objectAddress)");
                if (!bVar7) goto LAB_006b8713;
                *puVar12 = 0;
                TVar15.word = local_48.word;
              }
              BVar8 = BVStatic<2048UL>::Test
                                ((BVStatic<2048UL> *)TVar15.word,(uint)((ulong)pFVar13 >> 4) & 0x7ff
                                );
              uVar9 = (uint)(BVar8 != '\0');
              this = (SmallHeapBlockT<MediumAllocationBlockAttributes> *)local_40.word;
            }
          }
          Recycler::VerifyCheck
                    (uVar9,L"SmallHeapBlock memory written to after freed",this_01,this_01);
          Recycler::VerifyCheckFill(this_01 + 1,(ulong)this->objectSize - 8);
          uVar9 = local_38;
        }
      }
      this_01 = (FreeObject *)((long)&this_01->taggedNext + (ulong)this->objectSize);
      index = index + 1;
      i = i + uVar9;
    } while (index < this->objectCount);
  }
  if ((*corruptedAddress < 0xb) && ((0x528U >> (*corruptedAddress & 0x1f) & 1) != 0)) {
    pSVar11 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>(&this->super_HeapBlock)
    ;
    bVar7 = pSVar11->finalizeCount == local_32[0];
    pcVar4 = (this->super_HeapBlock).address;
    pSVar11 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>(&this->super_HeapBlock)
    ;
    Recycler::VerifyCheck
              ((uint)bVar7,L"SmallHeapBlock finalize count mismatch",pcVar4,&pSVar11->finalizeCount)
    ;
  }
  else if (local_32[0] != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x876,"(verifyFinalizeCount == 0)","verifyFinalizeCount == 0");
    if (!bVar7) {
LAB_006b8713:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar12 = 0;
  }
  return;
}

Assistant:

void SmallHeapBlockT<TBlockAttributes>::Verify(bool pendingDispose)
{
    ushort verifyFinalizeCount = 0;
    SmallHeapBlockBitVector tempFree;
    SmallHeapBlockBitVector *free = &tempFree;
    SmallHeapBlockBitVector tempPending;
    this->BuildFreeBitVector(free);
    Recycler * recycler = this->heapBucket->heapInfo->recycler;
    char * memBlock = this->GetAddress();
    uint objectBitDelta = this->GetObjectBitDelta();
    Recycler::VerifyCheck(!pendingDispose || this->IsAnyFinalizableBlock(),
        _u("Non-finalizable block shouldn't be disposing. May have corrupted block type."),
        this->GetAddress(), (void *)&this->heapBlockType);

    if (HasPendingDisposeObjects())
    {
        Assert(pendingDispose);

        // Pending object are not free yet, they don't have memory cleared.
        this->AsFinalizableBlock<TBlockAttributes>()->ForEachPendingDisposeObject([&](uint index) {

            uint bitIndex = ((uint)index) * this->GetObjectBitDelta();
            Assert(IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            Assert(free->Test(bitIndex));

            tempPending.Set(bitIndex);

            // We are a pending dispose block, so the finalize count hasn't been update yet.
            // Including the pending objects in the finalize count
            verifyFinalizeCount++;
        });
    }

    for (uint i = 0; i < objectCount; i++)
    {
        if (free->Test(i * objectBitDelta))
        {
            if (!tempPending.Test(i * objectBitDelta))
            {
                char * nextFree = (char *)((FreeObject *)memBlock)->GetNext();
                Recycler::VerifyCheck(nextFree == nullptr
                    || (nextFree >= address && nextFree < this->GetEndAddress()
                    && free->Test(GetAddressBitIndex(nextFree))),
                    _u("SmallHeapBlock memory written to after freed"), memBlock, memBlock);
                Recycler::VerifyCheckFill(memBlock + sizeof(FreeObject), this->GetObjectSize() - sizeof(FreeObject));
            }
        }
        else
        {
            if (explicitFreeBits.Test(i * objectBitDelta))
            {
                char * nextFree = (char *)((FreeObject *)memBlock)->GetNext();

                HeapBlock* nextFreeHeapBlock = this;

                if (nextFree != nullptr)
                {
                    nextFreeHeapBlock = recycler->FindHeapBlock(nextFree);
                }

                Recycler::VerifyCheck(nextFree == nullptr
                    || (nextFree >= address && nextFree < this->GetEndAddress()
                    && explicitFreeBits.Test(GetAddressBitIndex(nextFree)))
                    || nextFreeHeapBlock->GetObjectSize(nextFree) == this->objectSize,
                    _u("SmallHeapBlock memory written to after freed"), memBlock, memBlock);
                recycler->VerifyCheckPadExplicitFreeList(memBlock, this->GetObjectSize());
            }
            else
            {
                recycler->VerifyCheckPad(memBlock, this->GetObjectSize());
            }

            if ((this->ObjectInfo(i) & FinalizeBit) != 0)
            {
                if (this->IsAnyFinalizableBlock())
                {
                    verifyFinalizeCount++;
                }
                else
                {
                    Recycler::VerifyCheck(false, _u("Non-Finalizable block should not have finalizable objects"),
                        this->GetAddress(), &this->ObjectInfo(i));
                }
            }

        }
        memBlock += this->GetObjectSize();
    }

    if (this->IsAnyFinalizableBlock())
    {
        Recycler::VerifyCheck(this->AsFinalizableBlock<TBlockAttributes>()->finalizeCount == verifyFinalizeCount,
            _u("SmallHeapBlock finalize count mismatch"), this->GetAddress(), &this->AsFinalizableBlock<TBlockAttributes>()->finalizeCount);
    }
    else
    {
        Assert(verifyFinalizeCount == 0);
    }
}